

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O1

void __thiscall
FastLinearExpert<1,_1>::FastLinearExpert
          (FastLinearExpert<1,_1> *this,Z *z,X *x,IMLE<1,_1,_FastLinearExpert> *_mixture)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ActualDstType actualDst;
  double dVar4;
  double dVar5;
  double dVar6;
  
  (this->super_LinearExpert<1,_1>).recompute = true;
  this->mixture = _mixture;
  (this->super_LinearExpert<1,_1>).alpha = (_mixture->param).alpha;
  dVar4 = (_mixture->param).wPsi;
  (this->super_LinearExpert<1,_1>).wPsi = dVar4;
  dVar1 = (_mixture->param).wNu;
  (this->super_LinearExpert<1,_1>).wNu = dVar1;
  dVar3 = (_mixture->param).wSigma + 1.0 +
          *(double *)(&DAT_00167280 + (ulong)(-(uint)(dVar1 == 0.0) & 1) * 8);
  (this->super_LinearExpert<1,_1>).wSigma = dVar3;
  dVar5 = (_mixture->param).wLambda;
  (this->super_LinearExpert<1,_1>).wLambda = dVar5;
  dVar2 = (z->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.m_data.array
          [0];
  (this->super_LinearExpert<1,_1>).Nu0.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
  m_storage.m_data.array[0] = dVar2;
  (this->super_LinearExpert<1,_1>).H = 1e-06;
  (this->super_LinearExpert<1,_1>).Sh = 0.0;
  (this->super_LinearExpert<1,_1>).Sz.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
  m_storage.m_data.array[0] = 0.0;
  (this->super_LinearExpert<1,_1>).Sx.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
  m_storage.m_data.array[0] = 0.0;
  (this->super_LinearExpert<1,_1>).Sxz.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
  m_storage.m_data.array[0] = 0.0;
  (this->super_LinearExpert<1,_1>).Sxx.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
  m_storage.m_data.array[0] =
       dVar4 * (_mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
               m_storage.m_data.array[0];
  (this->invSzz).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
  [0] = 1.0 / dVar5;
  dVar5 = (_mixture->param).wSigma *
          (_mixture->Sigma).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
          m_data.array[0];
  dVar6 = 1.0 / dVar5;
  dVar4 = dVar2 * dVar6;
  (this->invSzz0).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
  array[0] = dVar6 - (dVar4 / (1.0 / dVar1 + dVar2 * dVar4)) * dVar4;
  this->detInvSzz0 = dVar6 / (dVar2 * dVar4 * dVar1 + 1.0);
  (this->super_LinearExpert<1,_1>).Nu.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
  m_storage.m_data.array[0] =
       (z->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.m_data.array[0];
  (this->super_LinearExpert<1,_1>).Mu.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
  m_storage.m_data.array[0] =
       (x->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.m_data.array[0];
  (this->super_LinearExpert<1,_1>).Lambda.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] = 0.0;
  dVar4 = 1.0 / (dVar5 / dVar3);
  (this->super_LinearExpert<1,_1>).invSigma.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] = dVar4;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  (this->super_LinearExpert<1,_1>).sqrtDetInvSigma = dVar4;
  dVar4 = (this->mixture->Psi).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
          m_storage.m_data.array[0] / (2.0 / (this->super_LinearExpert<1,_1>).wPsi + 1.0);
  (this->super_LinearExpert<1,_1>).Psi.super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
  m_storage.m_data.array[0] = dVar4;
  dVar4 = 1.0 / dVar4;
  (this->super_LinearExpert<1,_1>).invPsi.
  super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] = dVar4;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  (this->super_LinearExpert<1,_1>).sqrtDetInvPsi = dVar4;
  (this->super_LinearExpert<1,_1>).recompute = true;
  return;
}

Assistant:

FAST_LINEAR_EXPERT_base::FastLinearExpert(Z const &z, X const &x, IMLE<d,D,::FastLinearExpert> *_mixture)
#endif
{
    mixture = _mixture;

    alpha = mixture->getParameters().alpha;
    wPsi = mixture->getParameters().wPsi;
    wNu = mixture->getParameters().wNu;
    wSigma = mixture->getParameters().wSigma + d + ((wNu==0) ? 1.0 : 2.0);
    wLambda = mixture->getParameters().wLambda;

    Nu0 = z;


    H = EPSILON;

    Sh = 0.0;
    Sz.setZero(d);
    Sx.setZero(D);
    Sxz.setZero(D,d);
    Sxx = wPsi * mixture->getPsi();
//Sxx = X::Zero(D);
    invSzz.setIdentity(d,d) /= wLambda;
    Z Sigma0 = mixture->getParameters().wSigma*mixture->getSigma();
    invSzz0 = Sigma0.cwiseInverse().asDiagonal();
	// Using Moore-Penrose Rank-1 update
	Z SZ = invSzz0 * Nu0;
	Scal DOT = Nu0.dot(SZ);
	Scal DEN = DOT + 1 / wNu;
	invSzz0 -= (SZ/DEN) * SZ.transpose();

	// Using Determinant Rank-1 update
	detInvSzz0 = 1.0 / Sigma0.prod();
	detInvSzz0 /= (DOT*wNu + 1.0);

    Nu = z;
    Mu = x;
    Lambda.setZero(D,d);
    invSigma = (Sigma0/wSigma).cwiseInverse().asDiagonal();
    sqrtDetInvSigma = sqrt( 1.0 / (Sigma0/wSigma).prod() );

    Psi = mixture->getPsi() / (1.0 + 2.0/wPsi) ;
    invPsi = Psi.cwiseInverse();
    sqrtDetInvPsi = sqrt(invPsi.prod());

//    invSzz.setIdentity(d,d) /= EPSILON;
//    invSzz0.setIdentity(d,d) /= this->w0 * this->sigma;
//    detInvSzz0 = 1.0 / pow(this->w0 * this->sigma, d);
//
//    this->Nu = z;
//    this->Mu = x;
//    this->Lambda.setZero(D,d);
//    this->invSSEzz.setZero(d,d);
//
//    this->invSigma.setIdentity(d,d) *=  (this->w0+d+1.0)/(this->w0*this->sigma);
//    this->sqrtDetInvSigma = pow((this->w0+d+1.0)/(this->w0*this->sigma), d/2.0);
//
//    this->recompute = true;
    recompute = true;
}